

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int nng_stream_listener_alloc(nng_stream_listener **lp,char *uri)

{
  int iVar1;
  nng_url *pnStack_28;
  int rv;
  nng_url *url;
  char *uri_local;
  nng_stream_listener **lp_local;
  
  url = (nng_url *)uri;
  uri_local = (char *)lp;
  lp_local._4_4_ = nng_url_parse(&stack0xffffffffffffffd8,uri);
  if (lp_local._4_4_ == 0) {
    iVar1 = nng_stream_listener_alloc_url((nng_stream_listener **)uri_local,pnStack_28);
    nng_url_free(pnStack_28);
    lp_local._4_4_ = iVar1;
  }
  return lp_local._4_4_;
}

Assistant:

int
nng_stream_listener_alloc(nng_stream_listener **lp, const char *uri)
{
	nng_url *url;
	int      rv;

	if ((rv = nng_url_parse(&url, uri)) != 0) {
		return (rv);
	}
	rv = nng_stream_listener_alloc_url(lp, url);
	nng_url_free(url);
	return (rv);
}